

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandInter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  char *pcVar2;
  int local_74;
  int i;
  Abc_Obj_t *pObj;
  int fVerbose;
  int fRelation;
  int fDelete2;
  int fDelete1;
  int c;
  int nArgcNew;
  char **pArgvNew;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk1;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pArgvNew = (char **)0x0;
  pNtk = (Abc_Ntk_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  pNtk1 = Abc_FrameReadNtk(pAbc);
  pObj._4_4_ = 0;
  pObj._0_4_ = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    fDelete2 = Extra_UtilGetopt(argv_local._4_4_,(char **)pNtk,"rvh");
    if (fDelete2 == -1) {
      _c = pNtk->nObjCounts + (long)globalUtilOptind * 2 + -0x18;
      fDelete1 = argv_local._4_4_ - globalUtilOptind;
      iVar1 = Abc_NtkPrepareTwoNtks
                        (_stdout,pNtk1,(char **)_c,fDelete1,&pNtk2,&pNtkRes,&fRelation,&fVerbose);
      if (iVar1 == 0) {
        pAbc_local._4_4_ = 1;
      }
      else {
        if (fDelete1 == 0) {
          Abc_Print(-1,"Deriving new circuit structure for the current network.\n");
          for (local_74 = 0; iVar1 = Abc_NtkPoNum(pNtkRes), local_74 < iVar1;
              local_74 = local_74 + 1) {
            pObj_00 = Abc_NtkPo(pNtkRes,local_74);
            Abc_ObjXorFaninC(pObj_00,0);
          }
        }
        if ((pObj._4_4_ == 0) || (iVar1 = Abc_NtkCoNum(pNtk2), iVar1 == 1)) {
          pArgvNew = (char **)Abc_NtkInter(pNtk2,pNtkRes,pObj._4_4_,(uint)pObj);
        }
        else {
          Abc_Print(-1,
                    "Computation of interplants as a relation only works for single-output functions.\n"
                   );
          Abc_Print(-1,
                    "Use command \"cone\" to extract one output cone from the multi-output network.\n"
                   );
        }
        if (fRelation != 0) {
          Abc_NtkDelete(pNtk2);
        }
        if (fVerbose != 0) {
          Abc_NtkDelete(pNtkRes);
        }
        if (pArgvNew == (char **)0x0) {
          Abc_Print(-1,"Command has failed.\n");
          pAbc_local._4_4_ = 0;
        }
        else {
          Abc_FrameReplaceCurrentNetwork(pAStack_18,(Abc_Ntk_t *)pArgvNew);
          pAbc_local._4_4_ = 0;
        }
      }
      return pAbc_local._4_4_;
    }
    if (fDelete2 == 0x68) break;
    if (fDelete2 == 0x72) {
      pObj._4_4_ = pObj._4_4_ ^ 1;
    }
    else {
      if (fDelete2 != 0x76) break;
      pObj._0_4_ = (uint)pObj ^ 1;
    }
  }
  Abc_Print(-2,"usage: inter [-rvh] <onset.blif> <offset.blif>\n");
  Abc_Print(-2,"\t         derives interpolant of two networks representing onset and offset;\n");
  pcVar2 = "no";
  if (pObj._4_4_ != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-r     : toggle computing interpolant as a relation [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if ((uint)pObj != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\t         \n");
  Abc_Print(-2,"\t         Comments:\n");
  Abc_Print(-2,"\t         \n");
  Abc_Print(-2,"\t         The networks given on the command line should have the same CIs/COs.\n");
  Abc_Print(-2,"\t         If only one network is given on the command line, this network\n");
  Abc_Print(-2,"\t         is assumed to be the offset, while the current network is the onset.\n");
  Abc_Print(-2,"\t         If no network is given on the command line, the current network is\n");
  Abc_Print(-2,"\t         assumed to be the onset and its complement is taken to be the offset.\n")
  ;
  Abc_Print(-2,"\t         The resulting interpolant is stored as the current network.\n");
  Abc_Print(-2,"\t         To verify that the interpolant agrees with the onset and the offset,\n");
  Abc_Print(-2,"\t         save it in file \"inter.blif\" and run the following:\n");
  Abc_Print(-2,"\t         (a) \"miter -i <onset.blif> <inter.blif>; iprove\"\n");
  Abc_Print(-2,"\t         (b) \"miter -i <inter.blif> <offset_inv.blif>; iprove\"\n");
  Abc_Print(-2,"\t         where <offset_inv.blif> is the network derived by complementing the\n");
  Abc_Print(-2,
            "\t         outputs of <offset.blif>: \"r <offset.blif>; st -i; w <offset_inv.blif>\"\n"
           );
  return 1;
}

Assistant:

int Abc_CommandInter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtk1, * pNtk2, * pNtkRes = NULL;
    char ** pArgvNew;
    int nArgcNew;
    int c, fDelete1, fDelete2;
    int fRelation;
    int fVerbose;
    extern Abc_Ntk_t * Abc_NtkInter( Abc_Ntk_t * pNtkOn, Abc_Ntk_t * pNtkOff, int fRelation, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fRelation = 0;
    fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "rvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'r':
            fRelation ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( !Abc_NtkPrepareTwoNtks( stdout, pNtk, pArgvNew, nArgcNew, &pNtk1, &pNtk2, &fDelete1, &fDelete2 ) )
        return 1;
    if ( nArgcNew == 0 )
    {
        Abc_Obj_t * pObj;
        int i;
        Abc_Print( -1, "Deriving new circuit structure for the current network.\n" );
        Abc_NtkForEachPo( pNtk2, pObj, i )
            Abc_ObjXorFaninC( pObj, 0 );
    }
    if ( fRelation && Abc_NtkCoNum(pNtk1) != 1 )
    {
        Abc_Print( -1, "Computation of interplants as a relation only works for single-output functions.\n" );
        Abc_Print( -1, "Use command \"cone\" to extract one output cone from the multi-output network.\n" );
    }
    else
        pNtkRes = Abc_NtkInter( pNtk1, pNtk2, fRelation, fVerbose );
    if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
    if ( fDelete2 ) Abc_NtkDelete( pNtk2 );

    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: inter [-rvh] <onset.blif> <offset.blif>\n" );
    Abc_Print( -2, "\t         derives interpolant of two networks representing onset and offset;\n" );
    Abc_Print( -2, "\t-r     : toggle computing interpolant as a relation [default = %s]\n", fRelation? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t         \n" );
    Abc_Print( -2, "\t         Comments:\n" );
    Abc_Print( -2, "\t         \n" );
    Abc_Print( -2, "\t         The networks given on the command line should have the same CIs/COs.\n" );
    Abc_Print( -2, "\t         If only one network is given on the command line, this network\n" );
    Abc_Print( -2, "\t         is assumed to be the offset, while the current network is the onset.\n" );
    Abc_Print( -2, "\t         If no network is given on the command line, the current network is\n" );
    Abc_Print( -2, "\t         assumed to be the onset and its complement is taken to be the offset.\n" );
    Abc_Print( -2, "\t         The resulting interpolant is stored as the current network.\n" );
    Abc_Print( -2, "\t         To verify that the interpolant agrees with the onset and the offset,\n" );
    Abc_Print( -2, "\t         save it in file \"inter.blif\" and run the following:\n" );
    Abc_Print( -2, "\t         (a) \"miter -i <onset.blif> <inter.blif>; iprove\"\n" );
    Abc_Print( -2, "\t         (b) \"miter -i <inter.blif> <offset_inv.blif>; iprove\"\n" );
    Abc_Print( -2, "\t         where <offset_inv.blif> is the network derived by complementing the\n" );
    Abc_Print( -2, "\t         outputs of <offset.blif>: \"r <offset.blif>; st -i; w <offset_inv.blif>\"\n" );
    return 1;
}